

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

void __thiscall itis::AVLTree<long_long>::display(AVLTree<long_long> *this)

{
  putchar(10);
  if (this->root == (AVLTreeNode<long_long> *)0x0) {
    printf("Empty");
  }
  else {
    display(this,this->root,0,0);
  }
  putchar(10);
  return;
}

Assistant:

void AVLTree<T>::display() {
    printf("\n");
    if (root != nullptr) {
      display(root);
    } else {
      printf("Empty");
    }
    printf("\n");
  }